

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixVfs_Filetype(char *zPath,jx9_context *pCtx)

{
  int iVar1;
  undefined1 local_b0 [4];
  int rc;
  stat st;
  jx9_context *pCtx_local;
  char *zPath_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)pCtx;
  iVar1 = stat(zPath,(stat *)local_b0);
  if (iVar1 == 0) {
    if (((uint)st.st_nlink & 0xf000) == 0x8000) {
      jx9_result_string((jx9_context *)st.__glibc_reserved[2],"file",4);
    }
    else if (((uint)st.st_nlink & 0xf000) == 0x4000) {
      jx9_result_string((jx9_context *)st.__glibc_reserved[2],"dir",3);
    }
    else if (((uint)st.st_nlink & 0xf000) == 0xa000) {
      jx9_result_string((jx9_context *)st.__glibc_reserved[2],"link",4);
    }
    else if (((uint)st.st_nlink & 0xf000) == 0x6000) {
      jx9_result_string((jx9_context *)st.__glibc_reserved[2],"block",5);
    }
    else if (((uint)st.st_nlink & 0xf000) == 0xc000) {
      jx9_result_string((jx9_context *)st.__glibc_reserved[2],"socket",6);
    }
    else if (((uint)st.st_nlink & 0xf000) == 0x1000) {
      jx9_result_string((jx9_context *)st.__glibc_reserved[2],"fifo",4);
    }
    else {
      jx9_result_string((jx9_context *)st.__glibc_reserved[2],"unknown",7);
    }
    zPath_local._4_4_ = 0;
  }
  else {
    jx9_result_string((jx9_context *)st.__glibc_reserved[2],"unknown",7);
    zPath_local._4_4_ = -1;
  }
  return zPath_local._4_4_;
}

Assistant:

static int UnixVfs_Filetype(const char *zPath, jx9_context *pCtx)
{
	struct stat st;
	int rc;
    rc = stat(zPath, &st);
	if( rc != 0 ){
	  /* Expand 'unknown' */
	  jx9_result_string(pCtx, "unknown", sizeof("unknown")-1);
	  return -1;
	}
	if(S_ISREG(st.st_mode) ){
		jx9_result_string(pCtx, "file", sizeof("file")-1);
	}else if(S_ISDIR(st.st_mode)){
		jx9_result_string(pCtx, "dir", sizeof("dir")-1);
	}else if(S_ISLNK(st.st_mode)){
		jx9_result_string(pCtx, "link", sizeof("link")-1);
	}else if(S_ISBLK(st.st_mode)){
		jx9_result_string(pCtx, "block", sizeof("block")-1);
    }else if(S_ISSOCK(st.st_mode)){
		jx9_result_string(pCtx, "socket", sizeof("socket")-1);
	}else if(S_ISFIFO(st.st_mode)){
       jx9_result_string(pCtx, "fifo", sizeof("fifo")-1);
	}else{
		jx9_result_string(pCtx, "unknown", sizeof("unknown")-1);
	}
	return JX9_OK;
}